

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Jsrt.cpp
# Opt level: O3

JsErrorCode JsGetStringLength(JsValueRef value,int *length)

{
  bool bVar1;
  Data DVar2;
  int iVar3;
  undefined8 in_RAX;
  JavascriptString *this;
  JsErrorCode JVar4;
  DebugCheckNoException local_28;
  
  if (value == (JsValueRef)0x0) {
    JVar4 = JsErrorInvalidArgument;
  }
  else if (length == (int *)0x0) {
    JVar4 = JsErrorNullArgument;
  }
  else {
    local_28._5_3_ = SUB83((ulong)in_RAX >> 0x28,0);
    local_28.__exceptionCheck.handledExceptionType = (ExceptionType)in_RAX;
    local_28.hasException = true;
    DVar2 = ExceptionCheck::Save();
    local_28.__exceptionCheck.handledExceptionType = DVar2.handledExceptionType;
    JVar4 = JsErrorInvalidArgument;
    if ((ulong)value >> 0x30 == 0) {
      bVar1 = Js::VarIsImpl<Js::JavascriptString>((RecyclableObject *)value);
      if (bVar1) {
        this = Js::VarTo<Js::JavascriptString>(value);
        iVar3 = Js::JavascriptString::GetLengthAsSignedInt(this);
        *length = iVar3;
        JVar4 = JsNoError;
      }
    }
    local_28.hasException = false;
    DebugCheckNoException::~DebugCheckNoException(&local_28);
  }
  return JVar4;
}

Assistant:

CHAKRA_API JsGetStringLength(_In_ JsValueRef value, _Out_ int *length)
{
    VALIDATE_JSREF(value);
    PARAM_NOT_NULL(length);

    BEGIN_JSRT_NO_EXCEPTION
    {
        if (!Js::VarIs<Js::JavascriptString>(value))
        {
            RETURN_NO_EXCEPTION(JsErrorInvalidArgument);
        }

        *length = Js::VarTo<Js::JavascriptString>(value)->GetLengthAsSignedInt();
    }